

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_hpf2_config *
ma_hpf2_config_init(ma_hpf2_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                   ma_uint32 sampleRate,double cutoffFrequency,double q)

{
  if (__return_storage_ptr__ != (ma_hpf2_config *)0x0) {
    __return_storage_ptr__->format = ma_format_unknown;
    __return_storage_ptr__->channels = 0;
    *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
    __return_storage_ptr__->cutoffFrequency = 0.0;
    __return_storage_ptr__->q = 0.0;
    __return_storage_ptr__->format = format;
    __return_storage_ptr__->channels = channels;
    __return_storage_ptr__->sampleRate = sampleRate;
    __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
    __return_storage_ptr__->q =
         (double)(~-(ulong)(q == 0.0) & (ulong)q | -(ulong)(q == 0.0) & 0x3fe6a09edbf8b9bb);
    return __return_storage_ptr__;
  }
  __assert_fail("sz == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                ,0x2fbb,"void ma_zero_memory_default(void *, size_t)");
}

Assistant:

static MA_INLINE void ma_zero_memory_default(void* p, size_t sz)
{
    if (p == NULL) {
        MA_ASSERT(sz == 0); /* If this is triggered there's an error with the calling code. */
        return;
    }

    if (sz > 0) {
        memset(p, 0, sz);
    }
}